

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::entered4(SPxSteepPR<double> *this,SPxId param_2,int n)

{
  pointer pdVar1;
  int iVar2;
  SPxBasisBase<double> *this_00;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  UpdateVector<double> *pUVar6;
  double *pdVar7;
  IdxSet *this_01;
  double *pdVar8;
  IdxSet *this_02;
  char *pcVar9;
  int in_EDX;
  long extraout_RDX;
  long lVar10;
  long extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  VectorBase<double> *in_RDI;
  double dVar12;
  double dVar13;
  double dVar14;
  SVectorBase<double> *pSVar15;
  undefined1 auVar16 [16];
  double xi_ip;
  int j;
  int i;
  double xi_p;
  IdxSet *coPidx;
  double *coPvec;
  IdxSet *pIdx;
  double *pVec;
  double *workVec_ptr;
  double *weights_ptr;
  double *coWeights_ptr;
  double delta;
  int in_stack_ffffffffffffff5c;
  SPxSolverBase<double> *in_stack_ffffffffffffff60;
  SVectorBase<double> *this_03;
  uint local_68;
  
  if ((-1 < in_EDX) &&
     (iVar2 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2ac9a2), in_EDX < iVar2)) {
    this_00 = SPxSolverBase<double>::basis
                        ((SPxSolverBase<double> *)
                         (in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    iVar2 = SPxBasisBase<double>::iteration(this_00);
    dVar12 = 1.0 / (double)iVar2 + 2.0;
    pdVar3 = VectorBase<double>::get_ptr((VectorBase<double> *)0x2aca02);
    pdVar4 = VectorBase<double>::get_ptr((VectorBase<double> *)0x2aca22);
    pdVar5 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2aca39);
    pUVar6 = SPxSolverBase<double>::pVec
                       ((SPxSolverBase<double> *)
                        (in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    UpdateVector<double>::delta(pUVar6);
    pdVar7 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2aca5f);
    SPxSolverBase<double>::pVec
              ((SPxSolverBase<double> *)
               (in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    this_01 = UpdateVector<double>::idx((UpdateVector<double> *)0x2aca7d);
    pUVar6 = SPxSolverBase<double>::coPvec
                       ((SPxSolverBase<double> *)
                        (in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    UpdateVector<double>::delta(pUVar6);
    pdVar8 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2acaa3);
    SPxSolverBase<double>::coPvec
              ((SPxSolverBase<double> *)
               (in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    this_02 = UpdateVector<double>::idx((UpdateVector<double> *)0x2acac1);
    pUVar6 = SPxSolverBase<double>::fVec
                       ((SPxSolverBase<double> *)
                        (in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    UpdateVector<double>::delta(pUVar6);
    dVar13 = SSVectorBase<double>::operator[]
                       ((SSVectorBase<double> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
    ;
    local_68 = IdxSet::size(this_02);
    lVar10 = extraout_RDX;
    while (local_68 = local_68 - 1, -1 < (int)local_68) {
      pcVar9 = IdxSet::index(this_02,(char *)(ulong)local_68,(int)lVar10);
      iVar2 = (int)pcVar9;
      lVar10 = (long)iVar2;
      dVar14 = (1.0 / dVar13) * pdVar8[lVar10];
      pdVar3[iVar2] =
           dVar14 * (dVar14 * (double)in_RDI[0xd].val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                    pdVar5[iVar2] * 2.0) + pdVar3[iVar2];
      if (dVar12 <= pdVar3[iVar2]) {
        dVar14 = pdVar3[iVar2];
        auVar16 = infinity();
        lVar10 = auVar16._8_8_;
        if (*auVar16._0_8_ <= dVar14 && dVar14 != *auVar16._0_8_) {
          dVar14 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)0x2acc12);
          pdVar3[iVar2] = 1.0 / dVar14;
          lVar10 = extraout_RDX_00;
        }
      }
      else {
        pdVar3[iVar2] = dVar12;
      }
    }
    local_68 = IdxSet::size(this_01);
    uVar11 = extraout_RDX_01;
    while (local_68 = local_68 - 1, -1 < (int)local_68) {
      pcVar9 = IdxSet::index(this_01,(char *)(ulong)local_68,(int)uVar11);
      iVar2 = (int)pcVar9;
      pSVar15 = (SVectorBase<double> *)((1.0 / dVar13) * pdVar7[iVar2]);
      pdVar1 = in_RDI[0xd].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      this_03 = pSVar15;
      SPxSolverBase<double>::vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      dVar14 = SVectorBase<double>::operator*(this_03,in_RDI);
      pdVar4[iVar2] =
           (double)pSVar15 * ((double)pSVar15 * (double)pdVar1 - dVar14 * 2.0) + pdVar4[iVar2];
      if (dVar12 <= pdVar4[iVar2]) {
        in_stack_ffffffffffffff60 = (SPxSolverBase<double> *)pdVar4[iVar2];
        auVar16 = infinity();
        uVar11 = auVar16._8_8_;
        if (*auVar16._0_8_ <= (double)in_stack_ffffffffffffff60 &&
            (double)in_stack_ffffffffffffff60 != *auVar16._0_8_) {
          dVar14 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)0x2acd7c);
          pdVar4[iVar2] = 1.0 / dVar14;
          uVar11 = extraout_RDX_03;
        }
      }
      else {
        pdVar4[iVar2] = dVar12;
        uVar11 = extraout_RDX_02;
      }
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::entered4(SPxId /* id */, int n)
{
   assert(this->thesolver->type() == SPxSolverBase<R>::ENTER);

   if(n >= 0 && n < this->thesolver->dim())
   {
      R delta = 2 + 1.0 / this->thesolver->basis().iteration();
      R* coWeights_ptr = this->thesolver->coWeights.get_ptr();
      R* weights_ptr = this->thesolver->weights.get_ptr();
      const R* workVec_ptr = workVec.get_const_ptr();
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;
      R xi_ip;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         xi_ip = xi_p * coPvec[i];
         coWeights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * workVec_ptr[i]);

         /*
           if(coWeights_ptr[i] < 1)
           coWeights_ptr[i] = 1 / (2-x);
         */
         if(coWeights_ptr[i] < delta)
            coWeights_ptr[i] = delta;
         // coWeights_ptr[i] = 1;
         else if(coWeights_ptr[i] > R(infinity))
            coWeights_ptr[i] = 1 / this->thesolver->epsilon();
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         xi_ip = xi_p * pVec[i];
         weights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * (this->thesolver->vector(i) * workVec));

         /*
           if(weights_ptr[i] < 1)
           weights_ptr[i] = 1 / (2-x);
         */
         if(weights_ptr[i] < delta)
            weights_ptr[i] = delta;
         // weights_ptr[i] = 1;
         else if(weights_ptr[i] > R(infinity))
            weights_ptr[i] = 1.0 / this->thesolver->epsilon();
      }
   }

   /*@
     if(this->thesolver->isId(id))
     weights[   this->thesolver->number(id) ] *= 1.0001;
     else if(this->thesolver->isCoId(id))
     coWeights[ this->thesolver->number(id) ] *= 1.0001;
   */

}